

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-game.c
# Opt level: O2

void textui_process_command(void)

{
  cmd_info *pcVar1;
  _Bool _Var2;
  _Bool _Var3;
  undefined8 uVar4;
  cmd_info *pcVar5;
  char *pcVar6;
  ui_event uVar7;
  keypress kp;
  uchar key;
  char nestkey;
  wchar_t count;
  byte local_2e;
  byte local_2d;
  wchar_t local_2c;
  
  local_2c = L'\0';
  uVar7 = textui_get_command(&local_2c);
  uVar4 = uVar7._0_8_;
  local_2e = 0;
  switch(uVar7.type) {
  case EVT_KBRD:
  case EVT_BUTTON:
    _Var3 = (player->opts).opt[1];
    kp._8_4_ = uVar7._8_4_ & 0xff;
    kp.type = (int)uVar4;
    kp.code = (int)((ulong)uVar4 >> 0x20);
    _Var2 = textui_process_key(kp,&local_2e,local_2c);
    if ((ulong)local_2e != 0 || !_Var2) {
      if (local_2e == 0x9c) {
        pcVar5 = textui_action_menu_choose();
      }
      else {
        pcVar5 = (cmd_info *)converted_list[_Var3][local_2e];
      }
      if (pcVar5 == (cmd_info *)0x0 || !_Var2) {
        do_cmd_unknown();
      }
      else {
        if ((pcVar5->cmd == CMD_NULL) && (pcVar5->hook == (_func_void *)0x0)) {
          pcVar1 = pcVar5;
LAB_001d9b0b:
          pcVar5 = pcVar1;
          if (pcVar5 == (cmd_info *)0x0) {
            return;
          }
          if ((pcVar5->cmd == CMD_NULL) && (pcVar5->hook == (_func_void *)0x0)) {
            if (L'\0' < pcVar5->nested_keymap) goto code_r0x001d9b24;
            goto LAB_001d9b79;
          }
          goto LAB_001d9ac6;
        }
        _Var3 = key_confirm_command(local_2e);
        if (_Var3) {
LAB_001d9ac6:
          if ((pcVar5->prereq == (_func__Bool *)0x0) || (_Var3 = (*pcVar5->prereq)(), _Var3)) {
            if (pcVar5->hook == (_func_void *)0x0) {
              if (pcVar5->cmd != CMD_NULL) {
                cmdq_push_repeat(pcVar5->cmd,local_2c);
              }
            }
            else {
              (*pcVar5->hook)();
            }
          }
        }
      }
    }
    break;
  case EVT_MOUSE:
    uVar7._8_4_ = uVar7._8_4_ & 0xff;
    uVar7._0_4_ = (int)uVar4;
    uVar7._4_1_ = (char)((ulong)uVar4 >> 0x20);
    uVar7._5_1_ = (char)((ulong)uVar4 >> 0x28);
    uVar7._6_1_ = (char)((ulong)uVar4 >> 0x30);
    uVar7._7_1_ = (char)((ulong)uVar4 >> 0x38);
    textui_process_click(uVar7);
    break;
  case EVT_RESIZE:
    do_cmd_redraw();
  }
  return;
code_r0x001d9b24:
  pcVar1 = (cmd_info *)0x0;
  if (pcVar5->nested_keymap <= n_nested) {
    if ((pcVar5->nested_prompt != (char *)0x0) &&
       (_Var3 = get_com(pcVar5->nested_prompt,(char *)&local_2d), _Var3)) {
      pcVar1 = (cmd_info *)nested_lists[(long)pcVar5->nested_keymap + -1][local_2d];
      if ((cmd_info *)nested_lists[(long)pcVar5->nested_keymap + -1][local_2d] != (cmd_info *)0x0)
      goto LAB_001d9b0b;
      pcVar6 = pcVar5->nested_error;
      if (pcVar6 == (char *)0x0) {
        pcVar6 = "That is not a valid nested command.";
      }
      msg("%s",pcVar6);
    }
LAB_001d9b79:
    pcVar1 = (cmd_info *)0x0;
  }
  goto LAB_001d9b0b;
}

Assistant:

void textui_process_command(void)
{
	int count = 0;
	bool done = true;
	ui_event e = textui_get_command(&count);
	struct cmd_info *cmd = NULL;
	unsigned char key = '\0';
	int mode = OPT(player, rogue_like_commands) ? KEYMAP_MODE_ROGUE : KEYMAP_MODE_ORIG;

	switch (e.type) {
		case EVT_RESIZE: do_cmd_redraw(); return;
		case EVT_MOUSE: textui_process_click(e); return;
		case EVT_BUTTON:
		case EVT_KBRD: done = textui_process_key(e.key, &key, count); break;
		default: ;
	}

	/* Null command */
	if (!key && done)
		return;

	if (key == KC_ENTER) {
		/* Use command menus */
		cmd = textui_action_menu_choose();
	} else {
		/* Command key */
		cmd = converted_list[mode][key];
	}

	if (cmd && done) {
		if (cmd->cmd || cmd->hook) {
			/* Confirm for worn equipment inscriptions. */
			if (!key_confirm_command(key)) cmd = NULL;
		} else {
			/*
			 * It refers to nested commands.  Get the nested
			 * command.  Those aren't subject to keymaps and
			 * inherit the count.
			 */
			while (cmd && !cmd->cmd && !cmd->hook) {
				char nestkey;

				if (cmd->nested_keymap > 0 &&
						cmd->nested_keymap <= n_nested &&
						cmd->nested_prompt) {
					if (get_com(cmd->nested_prompt, &nestkey)) {
						const char* em =
							cmd->nested_error;

						cmd = nested_lists[cmd->nested_keymap - 1][(unsigned char) nestkey];
						if (!cmd) {
							msg("%s", em ? em : "That is not a valid nested command.");
						}
					} else {
						cmd = NULL;
					}
				} else {
					cmd = NULL;
				}
			}
		}

		/* Check prereqs. */
		if (cmd && cmd->prereq && !cmd->prereq()) cmd = NULL;

		/* Split on type of command */
		if (cmd && cmd->hook)
			/* UI command */
			cmd->hook();
		else if (cmd && cmd->cmd)
			/* Game command */
			cmdq_push_repeat(cmd->cmd, count);
	} else
		/* Error */
		do_cmd_unknown();
}